

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O2

void __thiscall
QAbstractItemModelTesterPrivate::rowsAboutToBeInserted
          (QAbstractItemModelTesterPrivate *this,QModelIndex *parent,int start,int end)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  QDebug *pQVar4;
  QObject *pQVar5;
  long in_FS_OFFSET;
  undefined1 local_150 [24];
  undefined1 local_138 [24];
  QArrayDataPointer<char16_t> local_120;
  QDebug local_108;
  undefined1 local_100 [24];
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  anon_union_24_3_e3d07ef4_for_data local_b8;
  undefined8 local_a0;
  anon_union_24_3_e3d07ef4_for_data local_98;
  undefined8 local_80;
  QVariant local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_d8._0_4_ = None;
  bVar2 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    (this,&this->changeInFlight,(ChangeInFlight *)local_d8,"changeInFlight",
                     "ChangeInFlight::None",
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                     ,0x330);
  if (bVar2) {
    this->changeInFlight = RowsInserted;
    lcModelTest();
    if (((byte)lcModelTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_d8._0_4_ = ColumnsMoved;
      local_d8._4_8_ = 0;
      local_d8._12_4_ = 0;
      local_d8._16_4_ = 0;
      local_d8._20_4_ = 0;
      local_d8._24_8_ = lcModelTest::category.name;
      QMessageLogger::debug();
      pQVar4 = QDebug::operator<<(&local_108,"rowsAboutToBeInserted");
      pQVar4 = QDebug::operator<<(pQVar4,"start=");
      pQVar4 = QDebug::operator<<(pQVar4,start);
      pQVar4 = QDebug::operator<<(pQVar4,"end=");
      pQVar4 = QDebug::operator<<(pQVar4,end);
      pQVar4 = QDebug::operator<<(pQVar4,"parent=");
      local_100._0_8_ = pQVar4->stream;
      *(int *)(local_100._0_8_ + 0x28) = *(int *)(local_100._0_8_ + 0x28) + 1;
      operator<<((Stream *)(local_100 + 8),(QModelIndex *)local_100);
      pQVar4 = QDebug::operator<<((QDebug *)(local_100 + 8),"parent data=");
      pQVar5 = (this->model).wp.value;
      (**(code **)(*(long *)pQVar5 + 0x90))(&local_58,pQVar5,parent,0);
      QVariant::toString();
      pQVar4 = QDebug::operator<<(pQVar4,(QString *)&local_120);
      pQVar4 = QDebug::operator<<(pQVar4,"current count of parent=");
      pQVar5 = (this->model).wp.value;
      iVar3 = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,parent);
      pQVar4 = QDebug::operator<<(pQVar4,iVar3);
      pQVar4 = QDebug::operator<<(pQVar4,"last before insertion=");
      local_100._16_8_ = pQVar4->stream;
      *(int *)(local_100._16_8_ + 0x28) = *(int *)(local_100._16_8_ + 0x28) + 1;
      pQVar5 = (this->model).wp.value;
      (**(code **)(*(long *)pQVar5 + 0x60))(local_138,pQVar5,start + -1,0,parent);
      operator<<((Stream *)local_e8,(QModelIndex *)(local_100 + 0x10));
      iVar3 = (((this->model).wp.d)->strongref)._q_value.super___atomic_base<int>._M_i;
      pQVar5 = (this->model).wp.value;
      (**(code **)(*(long *)pQVar5 + 0x60))(local_150,pQVar5,start + -1,0,parent);
      if (iVar3 == 0) {
        pQVar5 = (QObject *)0x0;
      }
      (**(code **)(*(long *)pQVar5 + 0x90))(&local_78,pQVar5,local_150,0);
      operator<<((QDebug *)(local_e8 + 8),(QVariant *)local_e8);
      QDebug::~QDebug((QDebug *)(local_e8 + 8));
      QVariant::~QVariant(&local_78);
      QDebug::~QDebug((QDebug *)local_e8);
      QDebug::~QDebug((QDebug *)(local_100 + 0x10));
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
      QVariant::~QVariant((QVariant *)&local_58);
      QDebug::~QDebug((QDebug *)(local_100 + 8));
      QDebug::~QDebug((QDebug *)local_100);
      QDebug::~QDebug(&local_108);
    }
    local_d8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._16_8_ = 0;
    local_b8.shared = (PrivateShared *)0x0;
    local_b8._8_8_ = 0;
    local_a0 = 2;
    local_98.shared = (PrivateShared *)0x0;
    local_98._8_8_ = 0;
    local_98._16_8_ = 0;
    local_80 = 2;
    local_d8._0_4_ = parent->r;
    local_d8._4_8_ = *(undefined8 *)&parent->c;
    local_d8._12_4_ = *(undefined4 *)((long)&parent->i + 4);
    pQVar1 = (parent->m).ptr;
    local_d8._16_4_ = SUB84(pQVar1,0);
    local_d8._20_4_ = (undefined4)((ulong)pQVar1 >> 0x20);
    pQVar5 = (this->model).wp.value;
    iVar3 = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,parent);
    local_d8._24_4_ = iVar3;
    if (start < 1) {
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      local_40 = 2;
    }
    else {
      pQVar5 = (this->model).wp.value;
      (**(code **)(*(long *)pQVar5 + 0x60))(&local_78,pQVar5,start + -1,0,parent);
      QModelIndex::data((QVariant *)&local_58,(QModelIndex *)&local_78,0);
    }
    QVariant::operator=((QVariant *)&local_b8,(QVariant *)&local_58);
    QVariant::~QVariant((QVariant *)&local_58);
    if (start < (int)local_d8._24_4_) {
      pQVar5 = (this->model).wp.value;
      (**(code **)(*(long *)pQVar5 + 0x60))(&local_78,pQVar5,start,0,parent);
      QModelIndex::data((QVariant *)&local_58,(QModelIndex *)&local_78,0);
    }
    else {
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      local_40 = 2;
    }
    QVariant::operator=((QVariant *)&local_98,(QVariant *)&local_58);
    QVariant::~QVariant((QVariant *)&local_58);
    QList<QAbstractItemModelTesterPrivate::Changing>::
    emplaceBack<QAbstractItemModelTesterPrivate::Changing_const&>
              (&(this->insert).super_QList<QAbstractItemModelTesterPrivate::Changing>,
               (Changing *)local_d8);
    Changing::~Changing((Changing *)local_d8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModelTesterPrivate::rowsAboutToBeInserted(const QModelIndex &parent, int start, int end)
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::None);
    changeInFlight = ChangeInFlight::RowsInserted;

    qCDebug(lcModelTest) << "rowsAboutToBeInserted"
                         << "start=" << start << "end=" << end << "parent=" << parent
                         << "parent data=" << model->data(parent).toString()
                         << "current count of parent=" << model->rowCount(parent)
                         << "last before insertion=" << model->index(start - 1, 0, parent) << model->data(model->index(start - 1, 0, parent));

    Changing c;
    c.parent = parent;
    c.oldSize = model->rowCount(parent);
    c.last = (start - 1 >= 0) ? model->index(start - 1, 0, parent).data() : QVariant();
    c.next = (start < c.oldSize) ? model->index(start, 0, parent).data() : QVariant();
    insert.push(c);
}